

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void Eigen::internal::manage_caching_sizes(Action action,ptrdiff_t *l1,ptrdiff_t *l2)

{
  uint uVar1;
  ptrdiff_t *ppVar2;
  ptrdiff_t *ppVar3;
  ptrdiff_t *ppVar4;
  ptrdiff_t *ppVar5;
  
  if (manage_caching_sizes::m_l2CacheSize == 0) {
    uVar1 = queryL1CacheSize();
    manage_caching_sizes::m_l1CacheSize = 0x2000;
    if (0 < (int)uVar1) {
      manage_caching_sizes::m_l1CacheSize = (ptrdiff_t)uVar1;
    }
    uVar1 = queryTopLevelCacheSize();
    manage_caching_sizes::m_l2CacheSize = 0x100000;
    if (0 < (int)uVar1) {
      manage_caching_sizes::m_l2CacheSize = (ptrdiff_t)uVar1;
    }
  }
  if (action == SetAction) {
    ppVar5 = &manage_caching_sizes::m_l2CacheSize;
    ppVar4 = &manage_caching_sizes::m_l1CacheSize;
    ppVar2 = l2;
    ppVar3 = l1;
  }
  else {
    if (action != GetAction) {
      return;
    }
    ppVar2 = &manage_caching_sizes::m_l2CacheSize;
    ppVar3 = &manage_caching_sizes::m_l1CacheSize;
    ppVar4 = l1;
    ppVar5 = l2;
  }
  *ppVar4 = *ppVar3;
  *ppVar5 = *ppVar2;
  return;
}

Assistant:

inline void manage_caching_sizes(Action action, std::ptrdiff_t* l1=0, std::ptrdiff_t* l2=0)
{
  static std::ptrdiff_t m_l1CacheSize = 0;
  static std::ptrdiff_t m_l2CacheSize = 0;
  if(m_l2CacheSize==0)
  {
    m_l1CacheSize = manage_caching_sizes_helper(queryL1CacheSize(),8 * 1024);
    m_l2CacheSize = manage_caching_sizes_helper(queryTopLevelCacheSize(),1*1024*1024);
  }
  
  if(action==SetAction)
  {
    // set the cpu cache size and cache all block sizes from a global cache size in byte
    eigen_internal_assert(l1!=0 && l2!=0);
    m_l1CacheSize = *l1;
    m_l2CacheSize = *l2;
  }
  else if(action==GetAction)
  {
    eigen_internal_assert(l1!=0 && l2!=0);
    *l1 = m_l1CacheSize;
    *l2 = m_l2CacheSize;
  }
  else
  {
    eigen_internal_assert(false);
  }
}